

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

e_int16 OPLL_calc(OPLL *opll)

{
  uint uVar1;
  e_int16 eVar2;
  short sVar3;
  uint uVar4;
  
  if (opll->quality == 0) {
    eVar2 = calc(opll);
    return eVar2;
  }
  while( true ) {
    uVar1 = opll->oplltime;
    uVar4 = uVar1 - opll->realstep;
    if (opll->realstep <= uVar1) break;
    opll->oplltime = uVar1 + opll->opllstep;
    opll->prev = opll->next;
    eVar2 = calc(opll);
    opll->next = (int)eVar2;
  }
  opll->oplltime = uVar4;
  sVar3 = (short)(int)(((double)uVar4 * (double)opll->prev +
                       (double)(opll->opllstep - uVar4) * (double)opll->next) /
                      (double)opll->opllstep);
  opll->out = (int)sVar3;
  return sVar3;
}

Assistant:

e_int16
OPLL_calc (OPLL * opll)
{
  if (!opll->quality)
    return calc (opll);

  while (opll->realstep > opll->oplltime)
  {
    opll->oplltime += opll->opllstep;
    opll->prev = opll->next;
    opll->next = calc (opll);
  }

  opll->oplltime -= opll->realstep;
  opll->out = (e_int16) (((double) opll->next * (opll->opllstep - opll->oplltime)
                          + (double) opll->prev * opll->oplltime) / opll->opllstep);

  return (e_int16) opll->out;
}